

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O3

int __thiscall
chrono::ChFunction::FilePostscriptPlot
          (ChFunction *this,ChFile_ps *m_file,int plotY,int plotDY,int plotDDY)

{
  int j;
  long lVar1;
  int j_1;
  double dVar2;
  double dVar3;
  ChArray<> xf;
  ChArray<> yf;
  PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> local_98;
  PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  ChVector2<double> local_48;
  ChVector2<double> local_38;
  
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,800);
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,800);
  local_48.m_data[0] = (m_file->G_p).m_data[0];
  local_48.m_data[1] = (m_file->G_p).m_data[1];
  ChFile_ps::To_graph_from_page(m_file,&local_48);
  local_38.m_data[1] = (m_file->G_p).m_data[1];
  local_70 = local_58;
  local_38.m_data[0] = (m_file->G_p).m_data[0] + (m_file->Gs_p).m_data[0];
  ChFile_ps::To_graph_from_page(m_file,&local_38);
  local_68 = local_58;
  if (plotY != 0) {
    lVar1 = 0;
    local_60 = (local_58 - local_70) / 799.0;
    dVar3 = local_70;
    do {
      dVar2 = dVar3;
      local_78 = dVar3;
      (*this->_vptr_ChFunction[4])(this);
      if (local_98.m_storage.m_rows <= lVar1) goto LAB_008832b6;
      local_98.m_storage.m_data[lVar1] = local_78;
      if (local_88.m_storage.m_rows <= lVar1) goto LAB_008832b6;
      dVar3 = local_78 + local_60;
      local_88.m_storage.m_data[lVar1] = dVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 800);
    ChFile_ps::DrawGraphXY(m_file,(ChArray<> *)&local_88,(ChArray<> *)&local_98);
  }
  if (plotDY != 0) {
    lVar1 = 0;
    local_60 = (local_68 - local_70) / 799.0;
    dVar3 = local_70;
    do {
      dVar2 = dVar3;
      local_78 = dVar3;
      (*this->_vptr_ChFunction[5])(this);
      if (local_98.m_storage.m_rows <= lVar1) goto LAB_008832b6;
      local_98.m_storage.m_data[lVar1] = local_78;
      if (local_88.m_storage.m_rows <= lVar1) goto LAB_008832b6;
      dVar3 = local_78 + local_60;
      local_88.m_storage.m_data[lVar1] = dVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 800);
    ChFile_ps::DrawGraphXY(m_file,(ChArray<> *)&local_88,(ChArray<> *)&local_98);
  }
  if (plotDDY != 0) {
    lVar1 = 0;
    local_78 = (local_68 - local_70) / 799.0;
    dVar3 = local_70;
    do {
      local_70 = dVar3;
      (*this->_vptr_ChFunction[6])(this);
      if (local_98.m_storage.m_rows <= lVar1) {
LAB_008832b6:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                     );
      }
      local_98.m_storage.m_data[lVar1] = local_70;
      if (local_88.m_storage.m_rows <= lVar1) goto LAB_008832b6;
      local_88.m_storage.m_data[lVar1] = dVar3;
      lVar1 = lVar1 + 1;
      dVar3 = local_70 + local_78;
    } while (lVar1 != 800);
    ChFile_ps::DrawGraphXY(m_file,(ChArray<> *)&local_88,(ChArray<> *)&local_98);
  }
  if (local_98.m_storage.m_data != (double *)0x0) {
    free((void *)local_98.m_storage.m_data[-1]);
  }
  if (local_88.m_storage.m_data != (double *)0x0) {
    free((void *)local_88.m_storage.m_data[-1]);
  }
  return 1;
}

Assistant:

int ChFunction::FilePostscriptPlot(ChFile_ps* m_file, int plotY, int plotDY, int plotDDY) {
    int mresol = 800;
    ChArray<> yf(mresol);
    ChArray<> xf(mresol);
    double mx, xmin, xmax;
    ChVector2<> mp;

    // xmin
    mp = m_file->Get_G_p();
    mp = m_file->To_graph_from_page(mp);
    xmin = mp.x();
    // xmax
    mp = m_file->Get_G_p();
    mp.x() = mp.x() + m_file->Get_Gs_p().x();
    mp = m_file->To_graph_from_page(mp);
    xmax = mp.x();

    if (plotY) {
        mx = xmin;
        for (int j = 0; j < mresol; j++) {
            mp.x() = mx;
            mp.y() = this->Get_y(mx);
            xf(j) = mp.x();
            yf(j) = mp.y();
            mx += ((xmax - xmin) / ((double)mresol - 1.0));
        }
        m_file->DrawGraphXY(yf, xf);
    }
    if (plotDY) {
        mx = xmin;
        for (int j = 0; j < mresol; j++) {
            mp.x() = mx;
            mp.y() = this->Get_y_dx(mx);
            xf(j) = mp.x();
            yf(j) = mp.y();
            mx += ((xmax - xmin) / ((double)mresol - 1.0));
        }
        m_file->DrawGraphXY(yf, xf);
    }
    if (plotDDY) {
        mx = xmin;
        for (int j = 0; j < mresol; j++) {
            mp.x() = mx;
            mp.y() = this->Get_y_dxdx(mx);
            xf(j) = mp.x();
            yf(j) = mp.y();
            mx += ((xmax - xmin) / ((double)mresol - 1.0));
        }
        m_file->DrawGraphXY(yf, xf);
    }
    return 1;
}